

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

string * __thiscall
kratos::SystemVerilogCodeGen::enum_code_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Enum *enum_)

{
  undefined1 local_1c0 [8];
  Stream stream_;
  
  Stream::Stream((Stream *)local_1c0,(Generator *)0x0,(SystemVerilogCodeGen *)0x0);
  enum_code_((Stream *)local_1c0,(Enum *)this,false);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)&stream_.super_stringstream.field_0x90);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::enum_code(kratos::Enum* enum_) {
    Stream stream_(nullptr, nullptr);
    enum_code_(stream_, enum_, false);
    return stream_.str();
}